

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileManager.hpp
# Opt level: O0

pair<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node_*,_long>
__thiscall
sjtu::
DynamicFileManager<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
::newspace(DynamicFileManager<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
           *this)

{
  node *pnVar1;
  locType *in_RDI;
  pair<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node_*,_long>
  pVar2;
  node tmp;
  locType offset_;
  locType offset;
  long *in_stack_fffffffffffff948;
  node *in_stack_fffffffffffff950;
  node **__x;
  undefined8 local_690;
  undefined8 local_688;
  fpos local_680 [16];
  undefined1 local_670 [1608];
  node *local_28;
  node *local_20;
  locType *offset_00;
  LRUCache<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
  *in_stack_fffffffffffffff0;
  
  offset_00 = in_RDI;
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node::node
            (in_stack_fffffffffffff950);
  std::istream::seekg((long)(in_RDI + 1),_S_beg);
  std::istream::read((char *)(in_RDI + 1),(long)&local_20);
  std::ostream::seekp((long)(in_RDI + 3),_S_beg);
  std::ios::clear((long)in_RDI + *(long *)(in_RDI[1] + -0x18) + 8,0);
  local_680 = (fpos  [16])std::ostream::tellp();
  pnVar1 = (node *)std::fpos::operator_cast_to_long(local_680);
  if (pnVar1 == local_20) {
    std::ostream::write((char *)(in_RDI + 3),(long)local_670);
    local_28 = local_20 + 1;
    std::ostream::seekp((long)(in_RDI + 3),_S_beg);
    std::ostream::write((char *)(in_RDI + 3),(long)local_670);
    std::ostream::seekp((long)(in_RDI + 3),0xfffff9b8);
    std::ostream::write((char *)(in_RDI + 3),(long)&local_28);
  }
  else {
    std::fpos<__mbstate_t>::fpos
              ((fpos<__mbstate_t> *)in_stack_fffffffffffff950,(streamoff)in_stack_fffffffffffff948);
    std::istream::seekg(in_RDI + 1,local_690,local_688);
    std::istream::read((char *)(in_RDI + 1),(long)&local_28);
    std::ostream::seekp((long)(in_RDI + 3),_S_beg);
    std::ostream::write((char *)(in_RDI + 3),(long)&local_28);
  }
  __x = &local_20;
  LRUCache<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>::
  load(in_stack_fffffffffffffff0,offset_00);
  pVar2 = std::
          make_pair<sjtu::BplusTree<unsigned_long_long,long,100,std::less<unsigned_long_long>>::node*,long&>
                    (__x,in_stack_fffffffffffff948);
  return pVar2;
}

Assistant:

virtual std::pair<T * , locType> newspace() override
		{
			locType offset , offset_;T tmp;
			file.seekg(0 , std::ios_base::beg) , file.read(reinterpret_cast<char *> (&offset) , sizeof (locType));
			file.seekp(0 , std::ios_base::end) , file.clear();
			if (file.tellp() == offset)
			{
				file.write(reinterpret_cast<char *> (&tmp) , sizeof (T));
				offset_ = offset + sizeof (T) , file.seekp(0 , std::ios_base::beg);
				file.write(reinterpret_cast<char *> (&tmp) , sizeof (T));
				file.seekp(- sizeof (T) , std::ios_base::cur) , file.write(reinterpret_cast<char *> (&offset_) , sizeof (locType));
			}
			else
			{
				file.seekg(offset) , file.read(reinterpret_cast<char *> (&offset_) , sizeof (locType));
				//file.seekp(offset) , file.write(reinterpret_cast<char *> (&tmp) , sizeof (T));
				file.seekp(0 , std::ios_base::beg) , file.write(reinterpret_cast<char *> (&offset_) , sizeof (locType));
			}
			return std::make_pair(cache -> load(offset) , offset);
		}